

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_move_8_pi_pcdi(void)

{
  uint address;
  uint value;
  ulong uVar1;
  uint ea;
  uint res;
  
  value = OPER_PCDI_8();
  uVar1 = (ulong)(m68ki_cpu.ir >> 9 & 7);
  address = m68ki_cpu.dar[uVar1 + 8];
  m68ki_cpu.dar[uVar1 + 8] = address + 1;
  m68ki_write_8_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_8_pi_pcdi(void)
{
	uint res = OPER_PCDI_8();
	uint ea = EA_AX_PI_8();

	m68ki_write_8(ea, res);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}